

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kcm_mixer.c
# Opt level: O1

_Bool al_attach_mixer_to_mixer(ALLEGRO_MIXER *stream,ALLEGRO_MIXER *mixer)

{
  _Bool _Var1;
  char *string;
  
  if ((mixer->ss).spl_data.frequency == (stream->ss).spl_data.frequency) {
    if ((mixer->ss).spl_data.depth == (stream->ss).spl_data.depth) {
      if ((mixer->ss).spl_data.chan_conf == (stream->ss).spl_data.chan_conf) {
        _Var1 = al_attach_sample_instance_to_mixer(&stream->ss,mixer);
        return _Var1;
      }
      string = "Mixers of different channel configurations cannot be attached to one another";
    }
    else {
      string = "Mixers of different audio depths cannot be attached to one another";
    }
  }
  else {
    string = "Attempted to attach a mixer with different frequencies";
  }
  _al_set_error(2,string);
  return false;
}

Assistant:

bool al_attach_mixer_to_mixer(ALLEGRO_MIXER *stream, ALLEGRO_MIXER *mixer)
{
   ASSERT(mixer);
   ASSERT(stream);
   ASSERT(mixer != stream);

   if (mixer->ss.spl_data.frequency != stream->ss.spl_data.frequency) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Attempted to attach a mixer with different frequencies");
      return false;
   }

   if (mixer->ss.spl_data.depth != stream->ss.spl_data.depth) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Mixers of different audio depths cannot be attached to one another");
      return false;
   }

   if (mixer->ss.spl_data.chan_conf != stream->ss.spl_data.chan_conf) {
      _al_set_error(ALLEGRO_INVALID_OBJECT,
         "Mixers of different channel configurations cannot be attached to one another");
      return false;
   }

   return al_attach_sample_instance_to_mixer(&stream->ss, mixer);
}